

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O3

void filter(double *sig,int len_sig,double *filt,int len_filt,double *oup)

{
  double *oup_00;
  
  oup_00 = (double *)malloc((long)(len_sig + len_filt + -1) << 3);
  conv_direct(sig,len_sig,filt,len_filt,oup_00);
  if (0 < len_sig) {
    memcpy(oup,oup_00,(ulong)(uint)len_sig << 3);
  }
  free(oup_00);
  return;
}

Assistant:

void filter(double *sig, int len_sig, double *filt, int len_filt, double *oup) {
	int N,i;
	double *temp;
	/*
	 *
	 * filter returns the output which is of same length as the input
	 * unlike conv function
	 *
	 */
	
	N = len_sig + len_filt - 1;
	temp = (double*) malloc (sizeof(double) * N);
	
	conv_direct(sig,len_sig, filt, len_filt,temp);
	
	for (i = 0; i < len_sig; ++i) {
		oup[i] = temp[i];
	}
	
	free(temp);
	
	
}